

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O2

double __thiscall Curve::getYofX(Curve *this,double x)

{
  double *pdVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pdVar1 = (this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (x <= *pdVar1) {
    dVar5 = *(this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    lVar4 = (long)(this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    for (uVar3 = 1; uVar3 < (ulong)(lVar4 >> 3); uVar3 = uVar3 + 1) {
      if (x <= pdVar1[uVar3]) {
        dVar6 = pdVar1[uVar3] - pdVar1[uVar3 - 1];
        pdVar2 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar5 = pdVar2[uVar3 - 1];
        if ((dVar6 == 0.0) && (!NAN(dVar6))) {
          return dVar5;
        }
        return (pdVar2[uVar3] - dVar5) * ((x - pdVar1[uVar3 - 1]) / dVar6) + dVar5;
      }
    }
    dVar5 = *(double *)
             ((long)(this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar4 + -8);
  }
  return dVar5;
}

Assistant:

double Curve::getYofX(double x)
{
    if ( x <= xData[0] ) return yData[0];

    for (vector<double>::size_type i = 1; i < xData.size(); i++)
    {
        if ( x <= xData[i] )
        {
            double dx = xData[i] - xData[i-1];
            if ( dx == 0.0 ) return yData[i-1];
            return yData[i-1] + (x - xData[i-1]) / dx * (yData[i] - yData[i-1]);
        }
    }
    return yData[xData.size()-1];
}